

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000002061b0 = 0x2d2d2d2d2d2d2d;
    uRam00000000002061b7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_002061a0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000002061a8 = 0x2d2d2d2d2d2d2d;
    DAT_002061af = 0x2d;
    _DAT_00206190 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000206198 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00206180 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000206188 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000206178 = 0x2d2d2d2d2d2d2d2d;
    DAT_002061bf = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}